

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void deqp::gles3::Performance::anon_unknown_1::generateTwoPassRandomIterationOrder
               (vector<int,_std::allocator<int>_> *iterationOrder,int numSamples)

{
  pointer piVar1;
  pointer piVar2;
  int min;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int ndx;
  ulong uVar6;
  long lVar7;
  int ndx_1;
  long lVar8;
  ulong uVar9;
  Random rnd;
  
  deRandom_init(&rnd.m_rnd,0xabc);
  uVar6 = (long)(numSamples + 1) / 2;
  min = (int)uVar6;
  piVar1 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  uVar9 = 0;
  if (0 < min) {
    uVar9 = uVar6 & 0xffffffff;
  }
  for (; (uint)((int)uVar9 * 2) != uVar4; uVar4 = uVar4 + 2) {
    *(int *)((long)piVar1 + uVar4 * 2) = (int)uVar4;
  }
  piVar1 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = 1;
  lVar8 = (long)min;
  for (lVar7 = lVar8; lVar7 < numSamples; lVar7 = lVar7 + 1) {
    piVar1[lVar7] = iVar5;
    iVar5 = iVar5 + 2;
  }
  for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    piVar1 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = de::Random::getInt(&rnd,0,min + -1);
    piVar2 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = piVar1[uVar6];
    piVar1[uVar6] = piVar2[iVar3];
    piVar2[iVar3] = iVar5;
  }
  while( true ) {
    piVar1 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = (int)((ulong)((long)(iterationOrder->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
    if (iVar5 <= lVar8) break;
    iVar3 = de::Random::getInt(&rnd,min,iVar5 + -1);
    piVar2 = (iterationOrder->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = piVar1[lVar8];
    piVar1[lVar8] = piVar2[iVar3];
    piVar2[iVar3] = iVar5;
    lVar8 = lVar8 + 1;
  }
  return;
}

Assistant:

static void generateTwoPassRandomIterationOrder (std::vector<int>& iterationOrder, int numSamples)
{
	de::Random	rnd			(0xabc);
	const int	midPoint	= (numSamples+1) / 2;		// !< ceil(m_numSamples / 2)

	DE_ASSERT((int)iterationOrder.size() == numSamples);

	// Two "passes" over range, randomize order in both passes
	// This allows to us detect if iterations are not independent
	// (first run and later run samples differ significantly?)

	for (int sampleNdx = 0; sampleNdx < midPoint; ++sampleNdx)
		iterationOrder[sampleNdx] = sampleNdx * 2;
	for (int sampleNdx = midPoint; sampleNdx < numSamples; ++sampleNdx)
		iterationOrder[sampleNdx] = (sampleNdx - midPoint) * 2 + 1;

	for (int ndx = 0; ndx < midPoint; ++ndx)
		std::swap(iterationOrder[ndx], iterationOrder[rnd.getInt(0, midPoint - 1)]);
	for (int ndx = midPoint; ndx < (int)iterationOrder.size(); ++ndx)
		std::swap(iterationOrder[ndx], iterationOrder[rnd.getInt(midPoint, (int)iterationOrder.size()-1)]);
}